

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O1

void __thiscall arangodb::velocypack::Dumper::appendUInt(Dumper *this,uint64_t v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ulong uVar18;
  int iVar19;
  
  if (9999999999999999999 < v) {
    (*this->_sink->_vptr_Sink[2])(this->_sink,0x31);
  }
  if (999999999999999999 < v) {
    iVar19 = (int)((v / 1000000000000000000) / 10);
    uVar18 = (ulong)(uint)((int)(v / 1000000000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (99999999999999999 < v) {
    iVar19 = (int)((v / 100000000000000000) / 10);
    uVar18 = (ulong)(uint)((int)(v / 100000000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (9999999999999999 < v) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = v / 10000000000000000;
    iVar19 = SUB164(auVar1 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 10000000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (999999999999999 < v) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = v / 1000000000000000;
    iVar19 = SUB164(auVar2 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 1000000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (99999999999999 < v) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = v / 100000000000000;
    iVar19 = SUB164(auVar3 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 100000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (0x48c27394 < v >> 0xd) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = v / 10000000000000;
    iVar19 = SUB164(auVar4 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 10000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (0xe8d4a50 < v >> 0xc) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = v / 1000000000000;
    iVar19 = SUB164(auVar5 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 1000000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (0x2e90edc < v >> 0xb) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = v / 100000000000;
    iVar19 = SUB164(auVar6 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 100000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (0x9502f8 < v >> 10) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = v / 10000000000;
    iVar19 = SUB164(auVar7 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 10000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (999999999 < v) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = v / 1000000000;
    iVar19 = SUB164(auVar8 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 1000000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (99999999 < v) {
    auVar9._8_8_ = 0;
    auVar9._0_8_ = v / 100000000;
    iVar19 = SUB164(auVar9 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 100000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (9999999 < v) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = v / 10000000;
    iVar19 = SUB164(auVar10 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 10000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (999999 < v) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = v / 1000000;
    iVar19 = SUB164(auVar11 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 1000000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (99999 < v) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = v / 100000;
    iVar19 = SUB164(auVar12 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 100000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (9999 < v) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = v / 10000;
    iVar19 = SUB164(auVar13 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 10000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (999 < v) {
    auVar14._8_8_ = 0;
    auVar14._0_8_ = v / 1000;
    iVar19 = SUB164(auVar14 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 1000) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (99 < v) {
    auVar15._8_8_ = 0;
    auVar15._0_8_ = v / 100;
    iVar19 = SUB164(auVar15 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 100) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  if (9 < v) {
    auVar16._8_8_ = 0;
    auVar16._0_8_ = v / 10;
    iVar19 = SUB164(auVar16 * ZEXT816(0x199999999999999a),8);
    uVar18 = (ulong)(uint)((int)(v / 10) + iVar19 * -10);
    (*this->_sink->_vptr_Sink[2])
              (this->_sink,uVar18 & 0xff | 0x30,(ulong)(uint)(iVar19 * 2),uVar18 | 0x30);
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = v;
  (*this->_sink->_vptr_Sink[2])
            (this->_sink,
             (ulong)(byte)((char)v + ((byte)(SUB164(auVar17 * ZEXT816(0xcccccccccccccccd),8) >> 2) &
                                     0xfe) * -5 | 0x30));
  return;
}

Assistant:

void Dumper::appendUInt(uint64_t v) {
  if (10000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000000ULL) % 10);
  }
  if (1000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000ULL) % 10);
  }
  if (100000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000000ULL) % 10);
  }
  if (10000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000ULL) % 10);
  }
  if (1000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000ULL) % 10);
  }
  if (100000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000ULL) % 10);
  }
  if (10000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000ULL) % 10);
  }
  if (1000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000ULL) % 10);
  }
  if (100000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000ULL) % 10);
  }
  if (10000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000ULL) % 10);
  }
  if (1000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000ULL) % 10);
  }
  if (100000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000ULL) % 10);
  }
  if (10000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000ULL) % 10);
  }
  if (1000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000ULL) % 10);
  }
  if (100000ULL <= v) {
    _sink->push_back('0' + (v / 100000ULL) % 10);
  }
  if (10000ULL <= v) {
    _sink->push_back('0' + (v / 10000ULL) % 10);
  }
  if (1000ULL <= v) {
    _sink->push_back('0' + (v / 1000ULL) % 10);
  }
  if (100ULL <= v) {
    _sink->push_back('0' + (v / 100ULL) % 10);
  }
  if (10ULL <= v) {
    _sink->push_back('0' + (v / 10ULL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}